

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba_kernels.h
# Opt level: O2

int Sweeper_thread_e(SweeperLite *sweeper)

{
  int iVar1;
  
  iVar1 = sweeper->nthread_octant * sweeper->nthread_e * sweeper->nthread_y * sweeper->nthread_z;
  if (iVar1 == 1) {
    return iVar1;
  }
  __assert_fail("sweeper->nthread_e * sweeper->nthread_octant * sweeper->nthread_y * sweeper->nthread_z == 1 || Env_omp_in_parallel()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/sweeper_kba_kernels.h"
                ,0x7b,"int Sweeper_thread_e(const SweeperLite *)");
}

Assistant:

TARGET_HD static inline int Sweeper_thread_e( const SweeperLite* sweeper )
{
#ifdef USE_OPENMP_TASKS
  Assert(sweeper->thread_e >= 0);
  return sweeper->thread_e;
#else
#ifdef __CUDA_ARCH__
  return Env_cuda_threadblock( 0 );
#else
  Assert( sweeper->nthread_e *
          sweeper->nthread_octant *
          sweeper->nthread_y *
          sweeper->nthread_z == 1 || Env_omp_in_parallel() );
  return Env_omp_thread() % sweeper->nthread_e;
#endif
#endif
}